

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O1

int __thiscall slang::parsing::Token::init(Token *this,EVP_PKEY_CTX *ctx)

{
  byte *pbVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined8 in_RCX;
  char cVar4;
  TokenKind in_DX;
  size_t size;
  ulong in_R8;
  SourceLocation in_R9;
  Trivia *triviaPtr;
  uint32_t in_stack_00000008;
  char *in_stack_00000010;
  
  this->kind = in_DX;
  *(undefined2 *)&this->field_0x2 = 0;
  this->rawLen = in_stack_00000008;
  sVar2 = getExtraSize(in_DX);
  if ((sVar2 & 7) == 0) {
    if (in_R8 == 0) {
      size = sVar2 + 0x10;
    }
    else {
      cVar4 = '\x1e';
      if (in_R8 < 0xf) {
        cVar4 = (char)in_R8 * '\x02';
      }
      size = sVar2 + 0x18;
      if (in_R8 >= 0xf) {
        size = sVar2 + 0x20;
      }
      this->field_0x2 = cVar4;
    }
    pIVar3 = (Info *)(*(long *)(*(long *)ctx + 8) + 7U & 0xfffffffffffffff8);
    pbVar1 = (byte *)((long)&pIVar3->rawTextPtr + size);
    if (*(byte **)(ctx + 8) < pbVar1) {
      pIVar3 = (Info *)BumpAllocator::allocateSlow((BumpAllocator *)ctx,size,8);
    }
    else {
      *(byte **)(*(long *)ctx + 8) = pbVar1;
    }
    this->info = pIVar3;
    pIVar3->location = in_R9;
    pIVar3 = this->info;
    pIVar3->rawTextPtr = in_stack_00000010;
    if ((in_R8 != 0) && (*(undefined8 *)((long)&pIVar3[1].rawTextPtr + sVar2) = in_RCX, 0xe < in_R8)
       ) {
      *(ulong *)(&pIVar3[1].location.field_0x0 + sVar2) = in_R8;
    }
    return (int)pIVar3;
  }
  assert::assertFailed
            ("extra % alignof(void*) == 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Token.cpp"
             ,0x1aa,
             "void slang::parsing::Token::init(BumpAllocator &, TokenKind, span<const Trivia>, string_view, SourceLocation)"
            );
}

Assistant:

void Token::init(BumpAllocator& alloc, TokenKind kind_, span<Trivia const> trivia,
                 string_view rawText, SourceLocation location) {
    kind = kind_;
    missing = false;
    triviaCountSmall = 0;
    reserved = 0;
    numFlags.raw = 0;
    rawLen = uint32_t(rawText.size());

    size_t extra = getExtraSize(kind);
    ASSERT(extra % alignof(void*) == 0);

    size_t size = sizeof(Info) + extra;
    if (!trivia.empty()) {
        size += sizeof(Trivia*);
        if (trivia.size() > MaxTriviaSmallCount) {
            size += sizeof(size_t);
            triviaCountSmall = MaxTriviaSmallCount + 1;
        }
        else {
            triviaCountSmall = uint8_t(trivia.size());
        }
    }

    info = (Info*)alloc.allocate(size, alignof(Info));
    info->location = location;
    info->rawTextPtr = rawText.data();

    if (!trivia.empty()) {
        const Trivia* triviaPtr = trivia.data();
        byte* dest = info->extra() + extra;
        memcpy(dest, &triviaPtr, sizeof(triviaPtr));

        if (trivia.size() > MaxTriviaSmallCount) {
            size = trivia.size();
            memcpy(dest + sizeof(triviaPtr), &size, sizeof(size_t));
        }
    }
}